

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_obj.cpp
# Opt level: O1

vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_> *
obj::load_from_stream<double>
          (vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>
           *__return_storage_ptr__,istream *is)

{
  double *pdVar1;
  undefined8 *puVar2;
  char *pcVar3;
  char cVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  int iVar8;
  _Storage<int,_true> _Var9;
  long *plVar10;
  ulong uVar11;
  _Optional_base<int,_true,_true> _Var12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  uint uVar16;
  char *pcVar17;
  char *__nptr;
  float fVar18;
  char *ptr;
  float z;
  vector<bvh::v2::Vec<double,_3UL>,_std::allocator<bvh::v2::Vec<double,_3UL>_>_> vertices;
  float y;
  float x;
  char line [1024];
  char *local_4c0;
  vector<bvh::v2::Tri<double,3ul>,std::allocator<bvh::v2::Tri<double,3ul>>> *local_4b8;
  float local_4ac;
  void *local_4a8;
  long lStack_4a0;
  long local_498;
  Vec<double,_3UL> local_488;
  Vec<double,_3UL> local_468;
  Vec<double,_3UL> local_450;
  char local_438 [1032];
  
  local_498 = 0;
  local_4a8 = (void *)0x0;
  lStack_4a0 = 0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8 = (vector<bvh::v2::Tri<double,3ul>,std::allocator<bvh::v2::Tri<double,3ul>>> *)
              __return_storage_ptr__;
  do {
    do {
      std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
      plVar10 = (long *)std::istream::getline((char *)is,(long)local_438,'\0');
      __nptr = local_438;
      if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
        if (local_4a8 != (void *)0x0) {
          operator_delete(local_4a8,local_498 - (long)local_4a8);
        }
        return (vector<bvh::v2::Tri<double,_3UL>,_std::allocator<bvh::v2::Tri<double,_3UL>_>_> *)
               local_4b8;
      }
      do {
        pcVar17 = __nptr;
        cVar4 = *pcVar17;
        iVar8 = isspace((int)cVar4);
        __nptr = pcVar17 + 1;
      } while (iVar8 != 0);
      local_4c0 = pcVar17;
    } while ((cVar4 == '\0') || (cVar4 == '#'));
    uVar11 = 0xffffffffffffffff;
    lVar7 = 1;
    do {
      lVar14 = lVar7;
      pcVar3 = __nptr + uVar11;
      uVar11 = uVar11 + 1;
      lVar7 = lVar14 + 1;
    } while (*pcVar3 != '\0');
    if (1 < uVar11) {
      do {
        uVar16 = (int)lVar14 - 2;
        iVar8 = isspace((int)pcVar17[uVar16]);
        if (iVar8 == 0) break;
        pcVar17[uVar16] = '\0';
        lVar14 = lVar14 + -1;
      } while (2 < lVar14);
    }
    if (*pcVar17 == 'f') {
      iVar8 = isspace((int)*__nptr);
      if (iVar8 != 0) {
        local_4c0 = pcVar17 + 2;
        _Var12._M_payload.super__Optional_payload_base<int> =
             (_Optional_payload<int,_true,_true,_true>)read_index(&local_4c0);
        if (((ulong)_Var12._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0) {
          pfVar15 = (float *)&local_468;
          uVar11 = 0;
          do {
            _Var9._M_value = _Var12._M_payload.super__Optional_payload_base<int>._M_payload;
            if (_Var9._M_value < 0) {
              uVar13 = (long)_Var9._M_value +
                       (lStack_4a0 - (long)local_4a8 >> 3) * -0x5555555555555555;
            }
            else {
              uVar13 = (ulong)(_Var9._M_value + -1);
            }
            if ((ulong)((lStack_4a0 - (long)local_4a8 >> 3) * -0x5555555555555555) <= uVar13) {
              __assert_fail("j < vertices.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/test/load_obj.cpp"
                            ,0x50,
                            "std::vector<Tri<T, 3>> obj::load_from_stream(std::istream &) [T = double]"
                           );
            }
            local_488.values[2] = *(double *)((long)local_4a8 + uVar13 * 0x18 + 0x10);
            pdVar1 = (double *)((long)local_4a8 + uVar13 * 0x18);
            local_488.values[0] = *pdVar1;
            local_488.values[1] = pdVar1[1];
            if (uVar11 < 2) {
              puVar2 = (undefined8 *)((long)local_4a8 + uVar13 * 0x18);
              uVar5 = *puVar2;
              uVar6 = puVar2[1];
              *(undefined8 *)(pfVar15 + 4) = puVar2[2];
              *(undefined8 *)pfVar15 = uVar5;
              *(undefined8 *)(pfVar15 + 2) = uVar6;
            }
            else {
              std::vector<bvh::v2::Tri<double,3ul>,std::allocator<bvh::v2::Tri<double,3ul>>>::
              emplace_back<bvh::v2::Vec<double,3ul>&,bvh::v2::Vec<double,3ul>&,bvh::v2::Vec<double,3ul>&>
                        (local_4b8,&local_468,&local_450,&local_488);
              local_450.values[2] = local_488.values[2];
              local_450.values[0] = local_488.values[0];
              local_450.values[1] = local_488.values[1];
            }
            uVar11 = uVar11 + 1;
            _Var12._M_payload.super__Optional_payload_base<int> =
                 (_Optional_payload<int,_true,_true,_true>)read_index(&local_4c0);
            pfVar15 = pfVar15 + 6;
          } while (((ulong)_Var12._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0);
        }
      }
    }
    else if ((*pcVar17 == 'v') && (iVar8 = isspace((int)*__nptr), iVar8 != 0)) {
      local_468.values[0]._0_4_ = strtof(__nptr,&local_4c0);
      fVar18 = strtof(local_4c0,&local_4c0);
      local_488.values[0] = (double)CONCAT44(local_488.values[0]._4_4_,fVar18);
      local_4ac = strtof(local_4c0,&local_4c0);
      std::vector<bvh::v2::Vec<double,3ul>,std::allocator<bvh::v2::Vec<double,3ul>>>::
      emplace_back<float&,float&,float&>
                ((vector<bvh::v2::Vec<double,3ul>,std::allocator<bvh::v2::Vec<double,3ul>>> *)
                 &local_4a8,(float *)&local_468,(float *)&local_488,&local_4ac);
    }
  } while( true );
}

Assistant:

inline std::vector<Tri<T, 3>> load_from_stream(std::istream& is) {
    static constexpr size_t max_line = 1024;
    char line[max_line];

    std::vector<Vec<T, 3>> vertices;
    std::vector<Tri<T, 3>> triangles;

    while (is.getline(line, max_line)) {
        char* ptr = strip_spaces(line);
        if (*ptr == '\0' || *ptr == '#')
            continue;
        remove_eol(ptr);
        if (*ptr == 'v' && std::isspace(ptr[1])) {
            auto x = std::strtof(ptr + 1, &ptr);
            auto y = std::strtof(ptr, &ptr);
            auto z = std::strtof(ptr, &ptr);
            vertices.emplace_back(x, y, z);
        } else if (*ptr == 'f' && std::isspace(ptr[1])) {
            Vec<T, 3> points[2];
            ptr += 2;
            for (size_t i = 0; ; ++i) {
                if (auto index = read_index(&ptr)) {
                    size_t j = *index < 0 ? vertices.size() + *index : *index - 1;
                    assert(j < vertices.size());
                    auto v = vertices[j];
                    if (i >= 2) {
                        triangles.emplace_back(points[0], points[1], v);
                        points[1] = v;
                    } else {
                        points[i] = v;
                    }
                } else {
                    break;
                }
            }
        }
    }

    return triangles;
}